

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_improved_flip(integral_image *iimage,interest_point *ipoint)

{
  bool bVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int s;
  int col;
  int iVar12;
  int row;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_var [60];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 in_register_00001444 [12];
  float local_ec;
  float local_e8;
  int local_e0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  float local_78;
  float local_68;
  undefined1 auVar39 [64];
  
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar35._8_4_ = 0x80000000;
  auVar35._0_8_ = 0x8000000080000000;
  auVar35._12_4_ = 0x80000000;
  fVar21 = ipoint->scale;
  auVar37 = ZEXT464((uint)fVar21);
  iVar12 = 0;
  lVar10 = 0;
  fVar2 = fVar21 * 2.5;
  auVar36 = ZEXT416((uint)fVar21);
  auVar13 = vpternlogd_avx512vl(auVar15,auVar36,auVar35,0xf8);
  auVar14 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)ipoint->y),auVar35,0xf8);
  auVar13 = ZEXT416((uint)(fVar21 + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  auVar14 = ZEXT416((uint)(ipoint->y + auVar14._0_4_));
  auVar14 = vroundss_avx(auVar14,auVar14,0xb);
  auVar16._0_8_ = (double)auVar14._0_4_;
  auVar16._8_8_ = auVar14._8_8_;
  s = (int)(auVar13._0_4_ + auVar13._0_4_);
  auVar13 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)ipoint->x),auVar35,0xf8);
  auVar34._0_8_ = (double)fVar21;
  auVar34._8_8_ = 0;
  auVar13 = ZEXT416((uint)(ipoint->x + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  auVar14 = vfmadd231sd_fma(auVar16,auVar34,ZEXT816(0x3fe0000000000000));
  auVar17._0_8_ = (double)auVar13._0_4_;
  auVar17._8_8_ = auVar13._8_8_;
  auVar13 = vfmadd231sd_fma(auVar17,auVar34,ZEXT816(0x3fe0000000000000));
  fVar38 = (float)auVar13._0_8_;
  auVar39 = ZEXT1664(CONCAT124(auVar13._4_12_,fVar38));
  auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
  fVar21 = 0.0;
  local_ec = -2.5;
  iVar7 = -8;
  do {
    auVar13._0_4_ = (float)iVar7;
    auVar13._4_12_ = in_register_00001444;
    lVar10 = (long)(int)lVar10;
    local_e0 = -3;
    local_ec = local_ec + 1.0;
    auVar13 = vfmadd213ss_fma(auVar13,auVar37._0_16_,auVar39._0_16_);
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar15 = vpternlogd_avx512vl(auVar33._0_16_,auVar13,auVar3,0xf8);
    auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar15._0_4_));
    auVar13 = vroundss_avx(auVar13,auVar13,0xb);
    auVar30._0_4_ = (int)auVar13._0_4_;
    auVar30._4_4_ = (int)auVar13._4_4_;
    auVar30._8_4_ = (int)auVar13._8_4_;
    auVar30._12_4_ = (int)auVar13._12_4_;
    local_e8 = -2.5;
    auVar13 = vcvtdq2ps_avx(auVar30);
    iVar8 = -8;
    do {
      auVar22._0_4_ = (float)iVar8;
      auVar22._4_12_ = in_register_00001444;
      auVar15 = vfmadd213ss_fma(auVar22,auVar37._0_16_,ZEXT416((uint)(float)auVar14._0_8_));
      iVar9 = iVar8 + -4;
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar16 = vpternlogd_avx512vl(auVar33._0_16_,auVar15,auVar4,0xf8);
      auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
      auVar15 = vroundss_avx(auVar15,auVar15,0xb);
      auVar23._0_4_ = (int)auVar15._0_4_;
      auVar23._4_4_ = (int)auVar15._4_4_;
      auVar23._8_4_ = (int)auVar15._8_4_;
      auVar23._12_4_ = (int)auVar15._12_4_;
      auVar15 = vcvtdq2ps_avx(auVar23);
      _local_c8 = ZEXT816(0) << 0x20;
      do {
        auVar24._0_4_ = (float)iVar9;
        auVar24._4_12_ = in_register_00001444;
        auVar16 = vfmadd213ss_fma(auVar24,auVar37._0_16_,ZEXT416((uint)(float)auVar14._0_8_));
        iVar11 = -0xc;
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        auVar17 = vpternlogd_avx512vl(auVar33._0_16_,auVar16,auVar5,0xf8);
        local_78 = auVar15._0_4_;
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,0xb);
        row = (int)auVar16._0_4_;
        auVar25._0_4_ = (int)auVar16._0_4_;
        auVar25._4_4_ = (int)auVar16._4_4_;
        auVar25._8_4_ = (int)auVar16._8_4_;
        auVar25._12_4_ = (int)auVar16._12_4_;
        auVar16 = vcvtdq2ps_avx(auVar25);
        local_78 = local_78 - auVar16._0_4_;
        do {
          auVar32._8_4_ = 0x80000000;
          auVar32._0_8_ = 0x8000000080000000;
          auVar32._12_4_ = 0x80000000;
          auVar26._0_4_ = (float)(iVar12 + iVar11);
          auVar26._4_12_ = in_register_00001444;
          auVar16 = vfmadd213ss_fma(auVar26,auVar37._0_16_,ZEXT416((uint)fVar38));
          auVar17 = vpternlogd_avx512vl(auVar32,auVar16,auVar33._0_16_,0xea);
          local_68 = auVar13._0_4_;
          auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
          auVar16 = vroundss_avx(auVar16,auVar16,0xb);
          col = (int)auVar16._0_4_;
          auVar27._0_4_ = (int)auVar16._0_4_;
          auVar27._4_4_ = (int)auVar16._4_4_;
          auVar27._8_4_ = (int)auVar16._8_4_;
          auVar27._12_4_ = (int)auVar16._12_4_;
          auVar16 = vcvtdq2ps_avx(auVar27);
          auVar16 = ZEXT416((uint)(local_68 - auVar16._0_4_));
          auVar16 = vfmadd213ss_fma(auVar16,auVar16,ZEXT416((uint)(local_78 * local_78)));
          fVar18 = expf(-auVar16._0_4_ / (fVar2 * (fVar2 + fVar2)));
          fVar18 = fVar18 * (1.0 / (fVar2 * 6.2831855 * fVar2));
          fVar19 = haarX_improved(iimage,row,col,s);
          auVar33._0_4_ = haarY_improved(iimage,row,col,s);
          auVar33._4_60_ = extraout_var;
          auVar16 = vinsertps_avx(auVar33._0_16_,ZEXT416((uint)fVar19),0x10);
          auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar37 = ZEXT1664(auVar36);
          iVar11 = iVar11 + 1;
          auVar28._0_4_ = auVar16._0_4_ * fVar18;
          auVar28._4_4_ = auVar16._4_4_ * fVar18;
          auVar28._8_4_ = auVar16._8_4_ * fVar18;
          auVar28._12_4_ = auVar16._12_4_ * fVar18;
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx512vl(auVar28,auVar6);
          auVar16 = vmovlhps_avx(auVar28,auVar16);
          local_c8._4_4_ = (undefined4)((ulong)local_c8 >> 0x20);
          uStack_c0._4_4_ = (float)((ulong)uStack_c0 >> 0x20);
          local_c8._0_4_ = (float)local_c8._0_4_ + auVar16._0_4_;
          local_c8._4_4_ = (float)local_c8._4_4_ + auVar16._4_4_;
          fVar18 = (float)uStack_c0 + auVar16._8_4_;
          fVar19 = uStack_c0._4_4_ + auVar16._12_4_;
          uStack_c0._0_4_ = fVar18;
          uStack_c0._4_4_ = fVar19;
        } while (iVar11 != -3);
        iVar9 = iVar9 + 1;
      } while (iVar9 != local_e0);
      local_e8 = local_e8 + 1.0;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_e8 * local_e8)),ZEXT416((uint)local_ec),
                                ZEXT416((uint)local_ec));
      fVar20 = expf(auVar15._0_4_ / -4.5);
      fVar20 = fVar20 * 0.07073553;
      auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      auVar37 = ZEXT1664(auVar36);
      local_e0 = local_e0 + 5;
      auVar29._0_4_ = fVar20 * (float)local_c8._0_4_;
      auVar29._4_4_ = fVar20 * (float)local_c8._4_4_;
      auVar29._8_4_ = fVar20 * fVar18;
      auVar29._12_4_ = fVar20 * fVar19;
      auVar31._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar31._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar31._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar31._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar16 = vshufpd_avx(auVar29,auVar29,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar10) = auVar29;
      lVar10 = lVar10 + 4;
      auVar15 = vmovshdup_avx(auVar31);
      auVar15 = vfmadd231ss_fma(auVar15,auVar29,auVar29);
      auVar16 = vfmadd213ss_fma(auVar16,auVar16,auVar15);
      auVar15 = vshufps_avx(auVar29,auVar29,0xff);
      auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar16);
      fVar21 = fVar21 + auVar15._0_4_;
      bVar1 = iVar8 < 3;
      iVar8 = iVar8 + 5;
    } while (bVar1);
    auVar39 = ZEXT464((uint)fVar38);
    iVar12 = iVar12 + 5;
    bVar1 = iVar7 < 3;
    iVar7 = iVar7 + 5;
  } while (bVar1);
  if (fVar21 < 0.0) {
    fVar21 = sqrtf(fVar21);
  }
  else {
    auVar13 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
    fVar21 = auVar13._0_4_;
  }
  lVar10 = 0;
  auVar33 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar21)));
  do {
    auVar37 = vmulps_avx512f(auVar33,*(undefined1 (*) [64])(ipoint->descriptor + lVar10));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar10) = auVar37;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_improved_flip(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - same as get_msurf_descriptor_improved
        - switched order of inner loops to go along x direction for better locality
    */

    float scale = ipoint->scale;
    float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;

                    //Get the gaussian weighted x and y responses
                    // TODO: (Sebastian) Precompute this...
                    float gauss_s1 = gaussianf(xs_sub_sample_x, ys_sub_sample_y, scale_mul_25f);
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussianf(cx, cy, 1.5f);

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}